

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.cpp
# Opt level: O1

int __thiscall slang::parsing::NumberParser::append(NumberParser *this,Token token,bool isFirst)

{
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  SourceLocation location;
  logic_t lVar4;
  uint uVar5;
  uint maxValue;
  byte *pbVar6;
  uint8_t *extraout_RDX;
  uint8_t *extraout_RDX_00;
  uint8_t *puVar7;
  uint8_t *extraout_RDX_01;
  uint8_t *extraout_RDX_02;
  uint8_t *extraout_RDX_03;
  uint8_t *extraout_RDX_04;
  uint8_t *extraout_RDX_05;
  DiagCode code;
  Diagnostics *this_00;
  size_t sVar8;
  int iVar9;
  bool bVar10;
  string_view sVar11;
  int local_64;
  Token local_50;
  Token local_40;
  
  local_40.info = token.info;
  local_40._0_8_ = token._0_8_;
  sVar11 = Token::rawText(&local_40);
  SmallVectorBase<char>::append<const_char_*>
            (&(this->text).super_SmallVectorBase<char>,sVar11._M_str,sVar11._M_str + sVar11._M_len);
  local_64 = -1;
  if (this->valid != true) {
    return -1;
  }
  this->valid = false;
  sVar11 = Token::rawText(&local_40);
  pbVar6 = (byte *)sVar11._M_str;
  sVar3 = sVar11._M_len;
  location = Token::location(&local_40);
  if ((sVar3 != 0 && isFirst) && (*pbVar6 == 0x5f)) {
    Diagnostics::add(this->diagnostics,(DiagCode)0x3,location);
    return -1;
  }
  maxValue = location._0_4_;
  switch(this->literalBase) {
  case Binary:
    if (sVar3 != 0) {
      sVar8 = 0;
      iVar9 = 0;
      puVar7 = (uint8_t *)((ulong)location >> 0x1c);
      do {
        bVar1 = pbVar6[sVar8];
        uVar5 = bVar1 - 0x3f;
        if (uVar5 < 0x3c) {
          puVar7 = "@";
          if ((0x800000008000001U >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
            puVar7 = (uint8_t *)0x200000002000000;
            if ((0x200000002000000U >> ((ulong)uVar5 & 0x3f) & 1) == 0) goto LAB_003ac6aa;
            puVar7 = &logic_t::x;
          }
          lVar4.value = *puVar7;
LAB_003ac680:
          addDigit(this,lVar4,(int)puVar7);
          puVar7 = extraout_RDX;
LAB_003ac690:
          iVar9 = iVar9 + 1;
          bVar10 = true;
        }
        else {
LAB_003ac6aa:
          if ((bVar1 & 0xfe) == 0x30) {
            lVar4.value = bVar1 - 0x30;
            goto LAB_003ac680;
          }
          if (bVar1 == 0x5f) goto LAB_003ac690;
          Diagnostics::add(this->diagnostics,(DiagCode)0x2,
                           (SourceLocation)
                           ((long)((int)(uint8_t *)((ulong)location >> 0x1c) + iVar9) * 0x10000000 +
                           (ulong)(maxValue & 0xfffffff)));
          bVar10 = false;
          puVar7 = extraout_RDX_00;
        }
        if (!bVar10) {
          return -1;
        }
        sVar8 = sVar8 + 1;
      } while (sVar3 != sVar8);
    }
    break;
  case Octal:
    if (sVar3 != 0) {
      sVar8 = 0;
      iVar9 = 0;
      puVar7 = (uint8_t *)((ulong)location >> 0x1c);
      do {
        bVar1 = pbVar6[sVar8];
        uVar5 = bVar1 - 0x3f;
        if (uVar5 < 0x3c) {
          puVar7 = "@";
          if ((0x800000008000001U >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
            puVar7 = (uint8_t *)0x200000002000000;
            if ((0x200000002000000U >> ((ulong)uVar5 & 0x3f) & 1) == 0) goto LAB_003ac8f6;
            puVar7 = &logic_t::x;
          }
          lVar4.value = *puVar7;
LAB_003ac8cc:
          addDigit(this,lVar4,(int)puVar7);
          puVar7 = extraout_RDX_04;
LAB_003ac8dc:
          iVar9 = iVar9 + 1;
          bVar10 = true;
        }
        else {
LAB_003ac8f6:
          if ((bVar1 & 0xf8) == 0x30) {
            lVar4.value = bVar1 - 0x30;
            goto LAB_003ac8cc;
          }
          if (bVar1 == 0x5f) goto LAB_003ac8dc;
          Diagnostics::add(this->diagnostics,(DiagCode)0x30002,
                           (SourceLocation)
                           ((long)((int)(uint8_t *)((ulong)location >> 0x1c) + iVar9) * 0x10000000 +
                           (ulong)(maxValue & 0xfffffff)));
          bVar10 = false;
          puVar7 = extraout_RDX_05;
        }
        if (!bVar10) {
          return -1;
        }
        sVar8 = sVar8 + 1;
      } while (sVar3 != sVar8);
    }
    break;
  case Decimal:
    if (isFirst) {
      if ((sVar3 == 1) && (uVar5 = *pbVar6 - 0x3f, uVar5 < 0x3c)) {
        if ((0x800000008000001U >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
          if ((0x200000002000000U >> ((ulong)uVar5 & 0x3f) & 1) == 0) goto LAB_003ac969;
          puVar7 = &logic_t::x;
        }
        else {
          puVar7 = "@";
        }
        addDigit(this,(logic_t)*puVar7,maxValue);
        break;
      }
LAB_003ac969:
      if (local_40.kind == IntegerLiteral) {
        Token::intValue(&local_50);
        SVInt::operator=(&this->decimalValue,(SVInt *)&local_50);
        if (((0x40 < (uint)local_50.info) || ((local_50.info._5_1_ & 1) != 0)) &&
           ((void *)local_50._0_8_ != (void *)0x0)) {
          operator_delete__((void *)local_50._0_8_);
        }
        break;
      }
    }
    if (sVar3 != 0) {
      sVar8 = 0;
      iVar9 = 0;
      do {
        bVar1 = pbVar6[sVar8];
        uVar5 = bVar1 - 0x3f;
        if (((uVar5 < 0x3c) && ((0xa0000000a000001U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) ||
           ((byte)(bVar1 - 0x30) < 10)) {
          if (this->hasUnknown == true) {
            this_00 = this->diagnostics;
            code.subsystem = Lexer;
            code.code = 4;
            goto LAB_003aca17;
          }
          if ((0x3b < uVar5) ||
             (bVar10 = true, (0xa0000000a000001U >> ((ulong)uVar5 & 0x3f) & 1) == 0)) {
            bVar10 = false;
          }
          this->hasUnknown = bVar10;
LAB_003aca35:
          iVar9 = iVar9 + 1;
          bVar10 = true;
        }
        else {
          if (bVar1 == 0x5f) goto LAB_003aca35;
          this_00 = this->diagnostics;
          code.subsystem = Lexer;
          code.code = 1;
LAB_003aca17:
          Diagnostics::add(this_00,code,
                           (SourceLocation)
                           ((long)((int)((ulong)location >> 0x1c) + iVar9) << 0x1c |
                           (ulong)(maxValue & 0xfffffff)));
          bVar10 = false;
        }
        if (!bVar10) {
          return -1;
        }
        sVar8 = sVar8 + 1;
      } while (sVar3 != sVar8);
    }
    break;
  case Hex:
    bVar10 = sVar3 == 0;
    if (!bVar10) {
      sVar8 = 0;
      iVar9 = 0;
      puVar7 = (uint8_t *)((ulong)location >> 0x1c);
      do {
        bVar1 = pbVar6[sVar8];
        uVar5 = bVar1 - 0x3f;
        if (uVar5 < 0x3c) {
          puVar7 = "@";
          if ((0x800000008000001U >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
            puVar7 = (uint8_t *)0x200000002000000;
            if ((0x200000002000000U >> ((ulong)uVar5 & 0x3f) & 1) == 0) goto LAB_003ac7bc;
            puVar7 = &logic_t::x;
          }
          lVar4.value = *puVar7;
LAB_003ac78e:
          addDigit(this,lVar4,(int)puVar7);
          puVar7 = extraout_RDX_01;
LAB_003ac79e:
          iVar9 = iVar9 + 1;
          bVar2 = true;
        }
        else {
LAB_003ac7bc:
          lVar4.value = bVar1 - 0x30;
          if (lVar4.value < 10) {
LAB_003ac7dc:
            if ('9' < (char)bVar1) {
              if ((char)bVar1 < 'G') {
                lVar4.value = bVar1 - 0x37;
              }
              else {
                lVar4.value = bVar1 + 0xa9;
              }
            }
            goto LAB_003ac78e;
          }
          puVar7 = (uint8_t *)(ulong)(bVar1 - 0x2b);
          if (bVar1 - 0x2b < 0x3c) {
            if ((0xfc000000fc00000U >> ((ulong)puVar7 & 0x3f) & 1) != 0) goto LAB_003ac7dc;
            if ((5UL >> ((ulong)puVar7 & 0x3f) & 1) != 0) {
              SmallVectorBase<char>::resizeImpl<slang::SmallVectorBase<char>::ValueInitTag>
                        (&(this->text).super_SmallVectorBase<char>,
                         ((long)iVar9 - sVar3) + (this->text).super_SmallVectorBase<char>.len,
                         (ValueInitTag *)&local_50);
              this->valid = true;
              bVar2 = false;
              puVar7 = extraout_RDX_02;
              local_64 = iVar9;
              goto LAB_003ac7a3;
            }
            if (puVar7 != (uint8_t *)0x34) goto LAB_003ac832;
            goto LAB_003ac79e;
          }
LAB_003ac832:
          Diagnostics::add(this->diagnostics,(DiagCode)0x20002,
                           (SourceLocation)
                           ((long)((int)(uint8_t *)((ulong)location >> 0x1c) + iVar9) * 0x10000000 +
                           (ulong)(maxValue & 0xfffffff)));
          local_64 = -1;
          bVar2 = false;
          puVar7 = extraout_RDX_03;
        }
LAB_003ac7a3:
        if (!bVar2) break;
        sVar8 = sVar8 + 1;
        bVar10 = sVar3 == sVar8;
      } while (!bVar10);
    }
    if (!bVar10) {
      return local_64;
    }
  }
  this->valid = true;
  return -1;
}

Assistant:

int NumberParser::append(Token token, bool isFirst) {
    text.append_range(token.rawText());

    // If we've had an error thus far, don't bother doing anything else that
    // might just add more errors on the pile.
    if (!valid)
        return -1;

    // set valid to false since we return early when we encounter errors
    // if we're still good at the end of the function we'll flip this back
    valid = false;

    // underscore as the first char is not allowed
    std::string_view chars = token.rawText();
    SourceLocation location = token.location();
    if (isFirst && chars.length() && chars[0] == '_') {
        addDiag(diag::DigitsLeadingUnderscore, location);
        return -1;
    }

    int index = 0;
    switch (literalBase) {
        case LiteralBase::Binary:
            for (char c : chars) {
                if (isLogicDigit(c))
                    addDigit(getLogicCharValue(c), 2);
                else if (isBinaryDigit(c))
                    addDigit(logic_t(getDigitValue(c)), 2);
                else if (c != '_') {
                    addDiag(diag::BadBinaryDigit, location + index);
                    return -1;
                }
                index++;
            }
            break;
        case LiteralBase::Octal:
            for (char c : chars) {
                if (isLogicDigit(c))
                    addDigit(getLogicCharValue(c), 8);
                else if (isOctalDigit(c))
                    addDigit(logic_t(getDigitValue(c)), 8);
                else if (c != '_') {
                    addDiag(diag::BadOctalDigit, location + index);
                    return -1;
                }
                index++;
            }
            break;
        case LiteralBase::Decimal:
            // Decimals have the restriction that you can only use x or z if it's the only digit.
            // Further, they can obviously only have decimal numbers (not A-F letters). Combined,
            // this means that we should only ever see one token here in practice, unless there's
            // an error. Optimize for this case and just suck the decimal value that's already
            // been computed out of the token itself.
            if (isFirst) {
                if (chars.length() == 1 && isLogicDigit(chars[0])) {
                    addDigit(getLogicCharValue(chars[0]), 10);
                    break;
                }

                if (token.kind == TokenKind::IntegerLiteral) {
                    decimalValue = token.intValue();
                    break;
                }
            }

            // As mentioned above, this loop is just for checking errors.
            for (char c : chars) {
                if (isLogicDigit(c) || isDecimalDigit(c)) {
                    if (hasUnknown) {
                        addDiag(diag::DecimalDigitMultipleUnknown, location + index);
                        return -1;
                    }

                    hasUnknown = isLogicDigit(c);
                }
                else if (c != '_') {
                    addDiag(diag::BadDecimalDigit, location + index);
                    return -1;
                }
                index++;
            }
            break;
        case LiteralBase::Hex:
            for (char c : chars) {
                if (isLogicDigit(c))
                    addDigit(getLogicCharValue(c), 16);
                else if (isHexDigit(c))
                    addDigit(logic_t(getHexDigitValue(c)), 16);
                else if (c == '+' || c == '-') {
                    // This is ok, this was initially lexed as a real token with exponent.
                    // Slice off everything after and including the operator, which will
                    // become new tokens.
                    text.resize(text.size() - (chars.size() - size_t(index)));
                    valid = true;
                    return index;
                }
                else if (c != '_') {
                    addDiag(diag::BadHexDigit, location + index);
                    return -1;
                }
                index++;
            }
            break;
    }

    valid = true;
    return -1;
}